

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLocalSetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  pointer pTVar1;
  pointer pTVar2;
  Index IVar3;
  Result RVar4;
  Location local_98;
  Var local_78;
  
  pTVar1 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar3 = SharedValidator::GetLocalCount(&this->validator_);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,param_1,&local_98);
  RVar4 = SharedValidator::OnLocalSet
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  if (RVar4.enum_ != Error) {
    Istream::Emit(this->istream_,LocalSet,
                  (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 2) + (IVar3 - param_1));
  }
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLocalSetExpr(Index local_index) {
  // See comment in OnLocalGetExpr above.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(validator_.OnLocalSet(loc, Var(local_index)));
  istream_.Emit(Opcode::LocalSet, translated_local_index);
  return Result::Ok;
}